

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O3

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this,Feature f)

{
  uint *puVar1;
  uint uVar2;
  string *psVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  
  iVar5 = (int)this;
  if (iVar5 < 0x200) {
    if (iVar5 < 0x20) {
      switch(iVar5) {
      case 1:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "threads";
        pcVar4 = "";
        break;
      case 2:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "mutable-globals";
        pcVar4 = "";
        break;
      case 3:
      case 5:
      case 6:
      case 7:
switchD_0010e272_caseD_3:
        pcVar4 = "unexpected feature";
        wasm::handle_unreachable
                  ("unexpected feature",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-features.h"
                   ,0x61);
        psVar3 = *(string **)pcVar4;
        uVar2 = *(uint *)((long)pcVar4 + 8);
        *(uint *)&psVar3[0xb]._M_dataplus._M_p = *(uint *)&psVar3[0xb]._M_dataplus._M_p | uVar2;
        puVar1 = (uint *)((long)&psVar3[0xb]._M_dataplus._M_p + 4);
        *puVar1 = *puVar1 & ~uVar2;
        return psVar3;
      case 4:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "nontrapping-float-to-int";
        pcVar4 = "";
        break;
      case 8:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "simd";
        pcVar4 = "";
        break;
      default:
        if (iVar5 != 0x10) goto switchD_0010e272_caseD_3;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "bulk-memory";
        pcVar4 = "";
      }
    }
    else if (iVar5 < 0x80) {
      if (iVar5 == 0x20) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "sign-ext";
        pcVar4 = "";
      }
      else {
        if (iVar5 != 0x40) goto switchD_0010e272_caseD_3;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "exception-handling";
        pcVar4 = "";
      }
    }
    else if (iVar5 == 0x80) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "tail-call";
      pcVar4 = "";
    }
    else {
      if (iVar5 != 0x100) goto switchD_0010e272_caseD_3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "reference-types";
      pcVar4 = "";
    }
  }
  else if (iVar5 < 0x2000) {
    if (iVar5 < 0x800) {
      if (iVar5 == 0x200) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "multivalue";
        pcVar4 = "";
      }
      else {
        if (iVar5 != 0x400) goto switchD_0010e272_caseD_3;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "gc";
        pcVar4 = "";
      }
    }
    else if (iVar5 == 0x800) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "memory64";
      pcVar4 = "";
    }
    else {
      if (iVar5 != 0x1000) goto switchD_0010e272_caseD_3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "gc-nn-locals";
      pcVar4 = "";
    }
  }
  else if (iVar5 < 0x8000) {
    if (iVar5 == 0x2000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "relaxed-simd";
      pcVar4 = "";
    }
    else {
      if (iVar5 != 0x4000) goto switchD_0010e272_caseD_3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "extended-const";
      pcVar4 = "";
    }
  }
  else if (iVar5 == 0x8000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "strings";
    pcVar4 = "";
  }
  else {
    if (iVar5 != 0x10000) goto switchD_0010e272_caseD_3;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "multi-memories";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(Feature f) {
    switch (f) {
      case Atomics:
        return "threads";
      case MutableGlobals:
        return "mutable-globals";
      case TruncSat:
        return "nontrapping-float-to-int";
      case SIMD:
        return "simd";
      case BulkMemory:
        return "bulk-memory";
      case SignExt:
        return "sign-ext";
      case ExceptionHandling:
        return "exception-handling";
      case TailCall:
        return "tail-call";
      case ReferenceTypes:
        return "reference-types";
      case Multivalue:
        return "multivalue";
      case GC:
        return "gc";
      case Memory64:
        return "memory64";
      case GCNNLocals:
        return "gc-nn-locals";
      case RelaxedSIMD:
        return "relaxed-simd";
      case ExtendedConst:
        return "extended-const";
      case Strings:
        return "strings";
      case MultiMemories:
        return "multi-memories";
      default:
        WASM_UNREACHABLE("unexpected feature");
    }
  }